

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O3

_Bool parse_color(element_t *element,int id,color_t *color,_Bool inherit)

{
  _Bool _Var1;
  uint uVar2;
  size_t sVar4;
  char *__s1;
  char *it;
  char *local_38;
  attribute *paVar3;
  
  do {
    for (paVar3 = element->attributes; paVar3 != (attribute *)0x0; paVar3 = paVar3->next) {
      if (paVar3->id == id) {
        if (inherit) {
          __s1 = (paVar3->value).data;
          sVar4 = (paVar3->value).length;
          if (sVar4 == 7) {
            sVar4 = 7;
            uVar2 = strncmp(__s1,"inherit",7);
            paVar3 = (attribute *)(ulong)uVar2;
            if (uVar2 == 0) break;
          }
        }
        else {
          __s1 = (paVar3->value).data;
          sVar4 = (paVar3->value).length;
        }
        local_38 = __s1;
        _Var1 = parse_color_value(&local_38,__s1 + sVar4,color);
        return _Var1;
      }
    }
    if ((!inherit) || (element = element->parent, element == (element *)0x0)) {
      return (_Bool)(char)paVar3;
    }
  } while( true );
}

Assistant:

static bool parse_color(const element_t* element, int id, color_t* color, bool inherit)
{
    const string_t* value = find_attribute(element, id, inherit);
    if(value == NULL)
        return false;
    const char* it = value->data;
    const char* end = it + value->length;
    if(parse_color_value(&it, end, color))
        return it == end;
    return false;
}